

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
::swap(btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
       *this,btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
             *x,allocator_type *alloc)

{
  template_ElementType<1L> tVar1;
  uint64 uVar2;
  S2ShapeIndexCell *pSVar3;
  btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
  *this_00;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  template_ElementType<2L> *ptVar10;
  template_ElementType<2L> *ptVar11;
  template_ElementType<3L> *__first1;
  template_ElementType<3L> *ppbVar12;
  template_ElementType<3L> *__first2;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar13;
  template_ElementType<0L> *ppbVar14;
  template_ElementType<1L> *ptVar15;
  template_ElementType<1L> *ptVar16;
  long lVar17;
  uint i;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *this_01;
  
  bVar4 = leaf(this);
  bVar5 = leaf(x);
  if (bVar4 != bVar5) {
    __assert_fail("leaf() == x->leaf()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x6bc,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>]"
                 );
  }
  bVar6 = count(this);
  bVar7 = count(x);
  this_01 = x;
  this_00 = (btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
             *)this;
  if (bVar7 < bVar6) {
    this_01 = this;
    this_00 = (btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
               *)x;
  }
  ptVar10 = btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
            ::GetField<2l>(this_00);
  ptVar11 = btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
            ::GetField<2l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                            *)this_01);
  bVar6 = count((btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)this_00);
  for (lVar17 = 0; (ulong)bVar6 * 0x10 != lVar17; lVar17 = lVar17 + 0x10) {
    uVar2 = (ptVar10->value).first.id_;
    (ptVar10->value).first.id_ = *(uint64 *)((long)ptVar11 + lVar17);
    *(uint64 *)((long)ptVar11 + lVar17) = uVar2;
    pSVar3 = (ptVar10->value).second;
    (ptVar10->value).second = *(S2ShapeIndexCell **)((long)ptVar11 + lVar17 + 8);
    *(S2ShapeIndexCell **)((long)ptVar11 + lVar17 + 8) = pSVar3;
    ptVar10 = ptVar10 + 1;
  }
  bVar6 = count(this_01);
  bVar7 = count((btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)this_00);
  bVar8 = count((btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)this_00);
  bVar9 = count((btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)this_00);
  uninitialized_move_n
            (this_01,(ulong)bVar6 - (ulong)bVar7,(ulong)bVar8,(ulong)bVar9,
             (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
              *)this_00,alloc);
  bVar8 = count((btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *)this_00);
  value_destroy_n(this_01,(ulong)bVar8,(ulong)bVar6 - (ulong)bVar7,alloc);
  bVar4 = leaf(this);
  if (!bVar4) {
    __first1 = btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
               ::GetField<3l>(this_00);
    bVar6 = count((btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                   *)this_00);
    ppbVar12 = btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
               ::GetField<3l>(this_00);
    __first2 = btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
               ::GetField<3l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                               *)this_01);
    std::
    swap_ranges<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>**,gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>**>
              (__first1,ppbVar12 + (ulong)bVar6 + 1,__first2);
    for (i = 0; bVar6 = count((btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                               *)this_00), i <= bVar6; i = i + 1) {
      pbVar13 = child((btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                       *)this_00,i);
      ppbVar14 = btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                 ::GetField<0l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                                 *)pbVar13);
      *ppbVar14 = (template_ElementType<0L>)this_00;
      pbVar13 = child(this_01,i);
      ppbVar14 = btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                 ::GetField<0l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                                 *)pbVar13);
      *ppbVar14 = this_01;
    }
    for (; bVar6 = count(this_01), i <= bVar6; i = i + 1) {
      pbVar13 = child(this_01,i);
      init_child((btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                  *)this_00,i,pbVar13);
      btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
      ::GetField<3l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                      *)this_01);
    }
  }
  ptVar15 = btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
            ::GetField<1l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                            *)this);
  ptVar16 = btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
            ::GetField<1l>((btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                            *)x);
  tVar1 = ptVar15[2];
  ptVar15[2] = ptVar16[2];
  ptVar16[2] = tVar1;
  return;
}

Assistant:

void btree_node<P>::swap(btree_node *x, allocator_type *alloc) {
  using std::swap;
  assert(leaf() == x->leaf());

  // Determine which is the smaller/larger node.
  btree_node *smaller = this, *larger = x;
  if (smaller->count() > larger->count()) {
    swap(smaller, larger);
  }

  // Swap the values.
  for (slot_type *a = smaller->slot(0), *b = larger->slot(0),
                 *end = a + smaller->count();
       a != end; ++a, ++b) {
    slot_type::swap(alloc, a, b);
  }

  // Move values that can't be swapped.
  const size_type to_move = larger->count() - smaller->count();
  larger->uninitialized_move_n(to_move, smaller->count(), smaller->count(),
                               smaller, alloc);
  larger->value_destroy_n(smaller->count(), to_move, alloc);

  if (!leaf()) {
    // Swap the child pointers.
    std::swap_ranges(&smaller->mutable_child(0),
                     &smaller->mutable_child(smaller->count() + 1),
                     &larger->mutable_child(0));
    // Update swapped children's parent pointers.
    int i = 0;
    for (; i <= smaller->count(); ++i) {
      smaller->child(i)->set_parent(smaller);
      larger->child(i)->set_parent(larger);
    }
    // Move the child pointers that couldn't be swapped.
    for (; i <= larger->count(); ++i) {
      smaller->init_child(i, larger->child(i));
      larger->clear_child(i);
    }
  }

  // Swap the counts.
  swap(mutable_count(), x->mutable_count());
}